

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShardedSupermapBuilder.hpp
# Opt level: O2

unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
 __thiscall
supermap::ShardedSupermapBuilder<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::
build(ShardedSupermapBuilder<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *this
     ,size_t nShards,unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *hasher,
     unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
     *nested,BuildParameters *params)

{
  ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *pEVar1;
  KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *pKVar2;
  __uniq_ptr_data<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>,_true,_true>
  *p_Var3;
  KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *pKVar4;
  _Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_false>
  _Var5;
  undefined8 uVar6;
  long lVar7;
  pointer *__ptr;
  unsigned_long __val;
  size_t i;
  ulong uVar8;
  KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *local_168;
  BuildParameters *local_160;
  size_t local_158;
  _Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_false>
  local_150;
  unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  long local_138;
  undefined1 local_130 [48];
  double local_100;
  vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
  nestedStorages;
  vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
  storages;
  path local_c8;
  path local_a0;
  string local_78;
  path local_58;
  
  local_160 = params;
  local_158 = nShards;
  std::
  vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
  ::vector(&nestedStorages,nShards,(allocator_type *)local_130);
  std::
  __uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
  ::operator=((__uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
               *)nestedStorages.
                 super__Vector_base<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
              (__uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
               *)nested);
  for (uVar8 = 1; uVar8 < local_158; uVar8 = uVar8 + 1) {
    pEVar1 = ((nestedStorages.
               super__Vector_base<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
             .
             super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
             ._M_head_impl;
    (**(pEVar1->
       super_AllowCreateLikeThis<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>
       )._vptr_AllowCreateLikeThis)
              ((allocator_type *)local_130,
               &pEVar1->
                super_AllowCreateLikeThis<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>
              );
    uVar6 = local_130._0_8_;
    local_130._0_8_ =
         (ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *)0x0;
    pEVar1 = nestedStorages.
             super__Vector_base<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
             super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
             .
             super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
             ._M_head_impl;
    nestedStorages.
    super__Vector_base<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
    super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
    .
    super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
    ._M_head_impl =
         (ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *)uVar6;
    if (pEVar1 != (ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *)
                  0x0) {
      (*(pEVar1->super_KeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>).
        _vptr_KeyValueStorage[5])();
    }
    if ((ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *)
        local_130._0_8_ !=
        (ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *)0x0) {
      (*((KeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *)local_130._0_8_)->
        _vptr_KeyValueStorage[5])();
    }
  }
  local_150._M_head_impl =
       (KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *)this;
  local_148 = hasher;
  std::
  vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
  ::vector(&storages,local_158,(allocator_type *)local_130);
  local_140 = &local_160->folderName;
  lVar7 = 0;
  for (__val = 0; local_158 != __val; __val = __val + 1) {
    p_Var3 = &(nestedStorages.
               super__Vector_base<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t;
    local_130._0_8_ = local_160->batchSize;
    local_130._8_8_ = local_160->maxNotSortedPart;
    local_138 = lVar7;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_c8,local_140,auto_format);
    std::__cxx11::to_string(&local_78,__val);
    std::filesystem::__cxx11::path::path(&local_58,&local_78,auto_format);
    std::filesystem::__cxx11::operator/(&local_a0,&local_c8,&local_58);
    std::__cxx11::string::string((string *)(local_130 + 0x10),(string *)&local_a0);
    local_100 = local_160->errorProbability;
    DefaultSupermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::build
              ((DefaultSupermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *)
               &local_168,
               (unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
                *)((long)&(p_Var3->
                          super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
                          )._M_t.
                          super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
                          .
                          super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
                          ._M_head_impl + lVar7),(BuildParameters *)local_130);
    pKVar4 = local_168;
    local_168 = (KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *
                )0x0;
    pKVar2 = storages.
             super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[__val]._M_t.
             super___uniq_ptr_impl<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
             .
             super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_false>
             ._M_head_impl;
    storages.
    super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[__val]._M_t.
    super___uniq_ptr_impl<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
    .
    super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_false>
    ._M_head_impl = pKVar4;
    if (pKVar2 != (KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>
                   *)0x0) {
      (*pKVar2->_vptr_KeyValueStorage[5])();
    }
    if (local_168 !=
        (KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *)0x0) {
      (**(code **)(*(long *)local_168 + 0x28))();
    }
    local_168 = (KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *
                )0x0;
    std::__cxx11::string::~string((string *)(local_130 + 0x10));
    std::filesystem::__cxx11::path::~path(&local_a0);
    std::filesystem::__cxx11::path::~path(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::filesystem::__cxx11::path::~path(&local_c8);
    lVar7 = local_138 + 8;
  }
  std::
  make_unique<supermap::KeyHashingShardedKVS<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>,std::vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>,std::default_delete<supermap::KeyValueStorage<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>>>,std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>,std::default_delete<supermap::KeyValueStorage<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>>>>>,std::unique_ptr<supermap::Hasher,std::default_delete<supermap::Hasher>>>
            ((vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
              *)local_130,
             (unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *)&storages);
  _Var5._M_head_impl = local_150._M_head_impl;
  (local_150._M_head_impl)->_vptr_KeyValueStorage = (_func_int **)local_130._0_8_;
  std::
  vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
  ::~vector(&storages);
  std::
  vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
  ::~vector(&nestedStorages);
  return (__uniq_ptr_data<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>,_true,_true>
          )(__uniq_ptr_data<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>,_true,_true>
            )_Var5._M_head_impl;
}

Assistant:

static std::unique_ptr<KeyValueStorage<Key, Value, IndexT>> build(
        std::size_t nShards,
        std::unique_ptr<Hasher> &&hasher,
        std::unique_ptr<NestedKvs> &&nested,
        const BuildParameters &params
    ) {
        std::vector<std::unique_ptr<NestedKvs>> nestedStorages(nShards);
        nestedStorages[0] = std::move(nested);
        for (std::size_t i = 1; i < nShards; ++i) {
            nestedStorages[i] = nestedStorages[0]->createLikeThis();
        }
        std::vector<std::unique_ptr<KVS>> storages(nShards);
        for (std::size_t shard = 0; shard < nShards; ++shard) {
            storages[shard] = DefaultSupermap<Key, Value, IndexT>::build(
                std::move(nestedStorages[shard]),
                BuildParameters{
                    params.batchSize,
                    params.maxNotSortedPart,
                    std::filesystem::path(params.folderName) / std::to_string(shard),
                    params.errorProbability,
                }
            );
        }

        return std::make_unique<KeyHashingShardedKVS<Key, Value, IndexT>>(
            std::move(storages),
            std::move(hasher)
        );
    }